

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

Constant * __thiscall
LLVMBC::ConstantDataArray::getElementAsConstant(ConstantDataArray *this,uint index)

{
  Constant *pCVar1;
  
  pCVar1 = cast<LLVMBC::Constant>
                     ((this->elements).
                      super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[index]);
  return pCVar1;
}

Assistant:

Constant *ConstantDataArray::getElementAsConstant(unsigned index) const
{
	return cast<Constant>(elements[index]);
}